

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type fmt::v5::
     visit_format_arg<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
               (arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     *arg)

{
  basic_string_view<wchar_t> value;
  type tVar1;
  type tVar2;
  iterator iVar3;
  
  switch(arg->type_) {
  case int_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.int_value);
    return (type)tVar2.container;
  case uint_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.uint_value);
    return (type)tVar2.container;
  case long_long_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.long_long_value);
    return (type)tVar2.container;
  case ulong_long_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.ulong_long_value);
    return (type)tVar2.container;
  case bool_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.int_value != 0);
    return (type)tVar2.container;
  case char_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.int_value);
    return (type)tVar2.container;
  case double_type:
    tVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
            ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                          *)vis,(arg->value_).field_0.double_value);
    return (type)tVar2.container;
  case last_numeric_type:
    tVar1.container =
         (basic_buffer<wchar_t> *)
         internal::
         arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
         operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                     *)vis,(arg->value_).field_0.long_double_value);
    break;
  case cstring_type:
    iVar3 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                         ,(arg->value_).field_0.string.value);
    return (type)iVar3.container;
  case string_type:
    value.data_ = *(wchar_t **)&(arg->value_).field_0;
    value.size_ = *(size_t *)((long)&(arg->value_).field_0 + 8);
    iVar3 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                         ,value);
    return (type)iVar3.container;
  case pointer_type:
    iVar3 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                         ,(arg->value_).field_0.pointer);
    return (type)iVar3.container;
  case custom_type:
    (*(arg->value_).field_0.custom.format)((void *)(arg->value_).field_0.long_long_value,vis->ctx_);
  default:
    tVar1.container =
         (vis->
         super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
         ).writer_.out_.container;
  }
  return (type)tVar1.container;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}